

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

XMLTranscoder * __thiscall
xercesc_4_0::ICUTransService::makeNewXMLTranscoder
          (ICUTransService *this,XMLCh *encodingName,Codes *resValue,XMLSize_t blockSize,
          MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  undefined4 extraout_var;
  UConverter *toAdopt;
  UConverter *converter;
  UErrorCode uerr;
  undefined1 local_88 [8];
  ArrayJanitor<char16_t> janTmp1;
  ArrayJanitor<char16_t> janTmp;
  UChar *tmpName;
  UChar *actualName;
  XMLSize_t moveSize;
  XMLSize_t workBufferSize;
  XMLCh *workBuffer;
  XMLCh *encodingNameToUse;
  MemoryManager *manager_local;
  XMLSize_t blockSize_local;
  Codes *resValue_local;
  XMLCh *encodingName_local;
  ICUTransService *this_local;
  
  workBufferSize = 0;
  bVar1 = XMLString::endsWith(encodingName,(XMLCh *)gs390Id);
  if ((bVar1) ||
     (bVar1 = XMLString::endsWith(encodingName,(XMLCh *)gS390Id), workBuffer = encodingName, bVar1))
  {
    XVar3 = XMLString::stringLen(encodingName);
    XVar4 = XMLString::stringLen((XMLCh *)gswaplfnlId);
    XVar5 = XMLString::stringLen((XMLCh *)gS390Id);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,(((XVar3 + XVar4) - XVar5) + 1) * 2);
    workBufferSize = CONCAT44(extraout_var,iVar2);
    XVar3 = XMLString::stringLen(encodingName);
    XVar4 = XMLString::stringLen((XMLCh *)gS390Id);
    XMLString::moveChars((XMLCh *)workBufferSize,encodingName,XVar3 - XVar4);
    XVar5 = XMLString::stringLen((XMLCh *)gswaplfnlId);
    XMLString::moveChars((XMLCh *)(workBufferSize + (XVar3 - XVar4) * 2),(XMLCh *)gswaplfnlId,XVar5)
    ;
    workBuffer = (XMLCh *)workBufferSize;
  }
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&janTmp1.fMemoryManager,(char16_t *)0x0,manager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)local_88,(char16_t *)workBufferSize,manager);
  converter._0_4_ = 0;
  toAdopt = (UConverter *)ucnv_openU_70(workBuffer,&converter);
  if (toAdopt == (UConverter *)0x0) {
    *resValue = UnsupportedEncoding;
    this_local = (ICUTransService *)0x0;
  }
  else {
    this_local = (ICUTransService *)XMemory::operator_new(0x38,manager);
    ICUTranscoder::ICUTranscoder((ICUTranscoder *)this_local,encodingName,toAdopt,blockSize,manager)
    ;
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_88);
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&janTmp1.fMemoryManager);
  return (XMLTranscoder *)this_local;
}

Assistant:

XMLTranscoder* ICUTransService::
makeNewXMLTranscoder(const  XMLCh* const            encodingName
                    ,       XMLTransService::Codes& resValue
                    , const XMLSize_t               blockSize
                    ,       MemoryManager* const    manager)
{
    //
    //  For encodings that end with "s390" we need to strip off the "s390"
    //  from the encoding name and add ",swaplfnl" to the encoding name
    //  that we pass into ICU on the ucnv_openU.
    //
    XMLCh* encodingNameToUse = (XMLCh*) encodingName;
    XMLCh* workBuffer = 0;

    if ( (XMLString::endsWith(encodingNameToUse, gs390Id)) ||
         (XMLString::endsWith(encodingNameToUse, gS390Id)) )
    {
       XMLSize_t workBufferSize = (XMLString::stringLen(encodingNameToUse) + XMLString::stringLen(gswaplfnlId) - XMLString::stringLen(gS390Id) + 1);
       workBuffer = (XMLCh*) manager->allocate(workBufferSize * sizeof(XMLCh));
       XMLSize_t moveSize = XMLString::stringLen(encodingNameToUse) - XMLString::stringLen(gS390Id);
       XMLString::moveChars(workBuffer, encodingNameToUse, moveSize);
       XMLString::moveChars((workBuffer + moveSize), gswaplfnlId, XMLString::stringLen(gswaplfnlId));
       encodingNameToUse = workBuffer;
    }

    //
    //  If UChar and XMLCh are not the same size, then we have premassage the
    //  encoding name into a UChar type string.
    //
    const UChar* actualName;
    UChar* tmpName = 0;
    if (sizeof(UChar) == sizeof(XMLCh))
    {
        actualName = (const UChar*)encodingNameToUse;
    }
    else
    {
        tmpName = convertToUChar(encodingNameToUse, 0, manager);
        actualName = tmpName;
    }

    ArrayJanitor<UChar> janTmp(tmpName, manager);
    ArrayJanitor<XMLCh> janTmp1(workBuffer, manager);

    UErrorCode uerr = U_ZERO_ERROR;
    UConverter* converter = ucnv_openU(actualName, &uerr);
    if (!converter)
    {
        resValue = XMLTransService::UnsupportedEncoding;
        return 0;
    }

    return new (manager) ICUTranscoder(encodingName, converter, blockSize, manager);
}